

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_sha1.c
# Opt level: O2

void csp_sha1_compress(csp_sha1_state_t *sha1,uint8_t *buf)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint32_t uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [85];
  
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    uVar1 = *(uint *)(buf + lVar6 * 4);
    auStack_184[lVar6 + 3] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  uVar2 = sha1->state[0];
  uVar3 = sha1->state[1];
  uVar1 = sha1->state[2];
  uVar4 = sha1->state[3];
  uVar5 = sha1->state[4];
  for (lVar6 = 0x10; lVar6 != 0x50; lVar6 = lVar6 + 1) {
    uVar8 = auStack_198[lVar6] ^ auStack_184[lVar6] ^ auStack_1b8[lVar6 + 2] ^ auStack_1b8[lVar6];
    auStack_184[lVar6 + 3] = uVar8 << 1 | (uint)((int)uVar8 < 0);
  }
  uVar14 = uVar5;
  uVar12 = uVar2;
  uVar10 = uVar3;
  uVar8 = uVar1;
  uVar7 = uVar4;
  for (uVar17 = 0; uVar17 < 0x14; uVar17 = uVar17 + 5) {
    uVar9 = uVar10 << 0x1e | uVar10 >> 2;
    uVar13 = (uVar12 << 5 | uVar12 >> 0x1b) + uVar14 + ((uVar7 ^ uVar8) & uVar10 ^ uVar7) +
             auStack_184[uVar17 + 3] + 0x5a827999;
    uVar7 = ((uVar9 ^ uVar8) & uVar12 ^ uVar8) + uVar7 + auStack_184[uVar17 + 4] + 0x5a827999 +
            (uVar13 * 0x20 | uVar13 >> 0x1b);
    uVar11 = uVar12 << 0x1e | uVar12 >> 2;
    uVar14 = uVar13 * 0x40000000 | uVar13 >> 2;
    uVar8 = uVar8 + auStack_184[uVar17 + 5] + ((uVar9 ^ uVar11) & uVar13 ^ uVar9) + 0x5a827999 +
            (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar10 = uVar9 + auStack_184[uVar17 + 6] + ((uVar14 ^ uVar11) & uVar7 ^ uVar11) + 0x5a827999 +
             (uVar8 * 0x20 | uVar8 >> 0x1b);
    uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar12 = uVar11 + auStack_184[uVar17 + 7] + ((uVar7 ^ uVar14) & uVar8 ^ uVar14) + 0x5a827999 +
             (uVar10 * 0x20 | uVar10 >> 0x1b);
    uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  }
  for (uVar17 = 0x14; uVar17 < 0x28; uVar17 = uVar17 + 5) {
    uVar13 = (uVar8 ^ uVar10 ^ uVar7) + (uVar12 << 5 | uVar12 >> 0x1b) + uVar14 +
             auStack_184[uVar17 + 3] + 0x6ed9eba1;
    uVar9 = uVar10 << 0x1e | uVar10 >> 2;
    uVar11 = uVar12 << 0x1e | uVar12 >> 2;
    uVar7 = (uVar12 ^ uVar8 ^ uVar9) + uVar7 + auStack_184[uVar17 + 4] + 0x6ed9eba1 +
            (uVar13 * 0x20 | uVar13 >> 0x1b);
    uVar8 = uVar8 + auStack_184[uVar17 + 5] + (uVar9 ^ uVar11 ^ uVar13) + 0x6ed9eba1 +
            (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar14 = uVar13 * 0x40000000 | uVar13 >> 2;
    uVar10 = uVar9 + auStack_184[uVar17 + 6] + (uVar14 ^ uVar11 ^ uVar7) + 0x6ed9eba1 +
             (uVar8 * 0x20 | uVar8 >> 0x1b);
    uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar12 = uVar11 + auStack_184[uVar17 + 7] + (uVar7 ^ uVar14 ^ uVar8) + 0x6ed9eba1 +
             (uVar10 * 0x20 | uVar10 >> 0x1b);
    uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  }
  for (uVar17 = 0x28; uVar17 < 0x3c; uVar17 = uVar17 + 5) {
    iVar15 = (uVar12 << 5 | uVar12 >> 0x1b) + uVar14 + ((uVar8 | uVar10) & uVar7 | uVar8 & uVar10) +
             auStack_184[uVar17 + 3];
    uVar16 = iVar15 + 0x8f1bbcdc;
    uVar11 = uVar10 << 0x1e | uVar10 >> 2;
    uVar13 = uVar12 << 0x1e | uVar12 >> 2;
    uVar9 = ((uVar11 | uVar12) & uVar8 | uVar11 & uVar12) + uVar7 + auStack_184[uVar17 + 4] +
            -0x70e44324 + (uVar16 * 0x20 | uVar16 >> 0x1b);
    uVar14 = iVar15 * 0x40000000 | uVar16 >> 2;
    uVar8 = uVar8 + auStack_184[uVar17 + 5] + ((uVar16 | uVar13) & uVar11 | uVar16 & uVar13) +
            -0x70e44324 + (uVar9 * 0x20 | uVar9 >> 0x1b);
    uVar7 = uVar9 * 0x40000000 | uVar9 >> 2;
    uVar10 = uVar11 + auStack_184[uVar17 + 6] + ((uVar9 | uVar14) & uVar13 | uVar9 & uVar14) +
             -0x70e44324 + (uVar8 * 0x20 | uVar8 >> 0x1b);
    uVar12 = uVar13 + auStack_184[uVar17 + 7] + ((uVar8 | uVar7) & uVar14 | uVar8 & uVar7) +
             -0x70e44324 + (uVar10 * 0x20 | uVar10 >> 0x1b);
    uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  }
  for (uVar17 = 0x3c; uVar17 < 0x50; uVar17 = uVar17 + 5) {
    uVar13 = (uVar8 ^ uVar10 ^ uVar7) + (uVar12 << 5 | uVar12 >> 0x1b) + uVar14 +
             auStack_184[uVar17 + 3] + 0xca62c1d6;
    uVar9 = uVar10 << 0x1e | uVar10 >> 2;
    uVar11 = uVar12 << 0x1e | uVar12 >> 2;
    uVar7 = (uVar12 ^ uVar8 ^ uVar9) + uVar7 + auStack_184[uVar17 + 4] + -0x359d3e2a +
            (uVar13 * 0x20 | uVar13 >> 0x1b);
    uVar8 = uVar8 + auStack_184[uVar17 + 5] + (uVar9 ^ uVar11 ^ uVar13) + -0x359d3e2a +
            (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar14 = uVar13 * 0x40000000 | uVar13 >> 2;
    uVar10 = uVar9 + auStack_184[uVar17 + 6] + (uVar14 ^ uVar11 ^ uVar7) + -0x359d3e2a +
             (uVar8 * 0x20 | uVar8 >> 0x1b);
    uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar12 = uVar11 + auStack_184[uVar17 + 7] + (uVar7 ^ uVar14 ^ uVar8) + -0x359d3e2a +
             (uVar10 * 0x20 | uVar10 >> 0x1b);
    uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  }
  sha1->state[0] = uVar12 + uVar2;
  sha1->state[1] = uVar10 + uVar3;
  sha1->state[2] = uVar8 + uVar1;
  sha1->state[3] = uVar7 + uVar4;
  sha1->state[4] = uVar14 + uVar5;
  return;
}

Assistant:

static void csp_sha1_compress(csp_sha1_state_t * sha1, const uint8_t * buf) {

	uint32_t a, b, c, d, e, W[80], i;

	/* Copy the state into 512-bits into W[0..15] */
	for (i = 0; i < 16; i++)
		LOAD32H(W[i], buf + (4 * i));

	/* Copy state */
	a = sha1->state[0];
	b = sha1->state[1];
	c = sha1->state[2];
	d = sha1->state[3];
	e = sha1->state[4];

	/* Expand it */
	for (i = 16; i < 80; i++)
		W[i] = ROL(W[i - 3] ^ W[i - 8] ^ W[i - 14] ^ W[i - 16], 1);

	/* Compress */
	i = 0;

	/* Round one */
	for (; i < 20;) {
		FF_0(a, b, c, d, e, i++);
		FF_0(e, a, b, c, d, i++);
		FF_0(d, e, a, b, c, i++);
		FF_0(c, d, e, a, b, i++);
		FF_0(b, c, d, e, a, i++);
	}

	/* Round two */
	for (; i < 40;) {
		FF_1(a, b, c, d, e, i++);
		FF_1(e, a, b, c, d, i++);
		FF_1(d, e, a, b, c, i++);
		FF_1(c, d, e, a, b, i++);
		FF_1(b, c, d, e, a, i++);
	}

	/* Round three */
	for (; i < 60;) {
		FF_2(a, b, c, d, e, i++);
		FF_2(e, a, b, c, d, i++);
		FF_2(d, e, a, b, c, i++);
		FF_2(c, d, e, a, b, i++);
		FF_2(b, c, d, e, a, i++);
	}

	/* Round four */
	for (; i < 80;) {
		FF_3(a, b, c, d, e, i++);
		FF_3(e, a, b, c, d, i++);
		FF_3(d, e, a, b, c, i++);
		FF_3(c, d, e, a, b, i++);
		FF_3(b, c, d, e, a, i++);
	}

	/* Store */
	sha1->state[0] += a;
	sha1->state[1] += b;
	sha1->state[2] += c;
	sha1->state[3] += d;
	sha1->state[4] += e;
}